

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

float64 propagateFloat64NaN(float64 a,float64 b,float_status *status)

{
  FloatClass a_cls;
  int iVar1;
  float64 fVar2;
  uint64_t a_2;
  FloatClass b_cls;
  float_status *pfVar3;
  uint64_t a_1;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  pfVar3 = (float_status *)0x7ff0000000000001;
  if ((a & 0x7fffffffffffffff) < 0x7ff0000000000001) {
    a_cls = float_class_normal;
    if ((b & 0x7fffffffffffffff) < 0x7ff0000000000001) {
      bVar6 = false;
      b_cls = float_class_normal;
      goto LAB_00b1a799;
    }
LAB_00b1a758:
    pfVar3 = (float_status *)0x7ff0000000000000;
    bVar4 = (b & 0x7ff8000000000000) == 0x7ff0000000000000;
    bVar5 = (b & 0x7ffffffffffff) != 0;
    bVar6 = a_cls == float_class_snan;
    b_cls = float_class_snan;
    if (bVar6) {
      b_cls = (bVar5 && bVar4) + float_class_qnan;
    }
    if ((bVar5 && bVar4) || (a_cls == float_class_snan)) {
LAB_00b1a78e:
      status->float_exception_flags = status->float_exception_flags | 1;
      goto LAB_00b1a799;
    }
    b_cls = float_class_qnan;
  }
  else {
    bVar6 = (a & 0x7ff8000000000000) == 0x7ff0000000000000;
    bVar4 = (a & 0x7ffffffffffff) != 0;
    if (0x7ff0000000000000 < (b & 0x7fffffffffffffff)) {
      a_cls = (bVar4 && bVar6) | float_class_qnan;
      goto LAB_00b1a758;
    }
    b_cls = float_class_normal;
    if (bVar4 && bVar6) {
      bVar6 = true;
      a_cls = float_class_snan;
      goto LAB_00b1a78e;
    }
    a_cls = float_class_qnan;
  }
  bVar6 = false;
LAB_00b1a799:
  if (status->default_nan_mode != '\0') {
    fVar2 = float64_default_nan_tricore(pfVar3);
    return fVar2;
  }
  if (a * 2 < b * 2) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (a * 2 <= b * 2) {
      bVar4 = a < b;
    }
  }
  pfVar3 = (float_status *)(ulong)b_cls;
  iVar1 = pickNaN(a_cls,b_cls,bVar4);
  if (iVar1 == 0) {
    if (!bVar6) {
      return a;
    }
  }
  else {
    a = b;
    if (b_cls != float_class_snan) {
      return b;
    }
  }
  fVar2 = float64_silence_nan_tricore(a,pfVar3);
  return fVar2;
}

Assistant:

static float64 propagateFloat64NaN(float64 a, float64 b, float_status *status)
{
    flag aIsLargerSignificand;
    uint64_t av, bv;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float64_is_any_nan(a)
             ? float_class_normal
             : float64_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float64_is_any_nan(b)
             ? float_class_normal
             : float64_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    av = float64_val(a);
    bv = float64_val(b);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float64_default_nan(status);
    }

    if ((uint64_t)(av << 1) < (uint64_t)(bv << 1)) {
        aIsLargerSignificand = 0;
    } else if ((uint64_t)(bv << 1) < (uint64_t)(av << 1)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (av < bv) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float64_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float64_silence_nan(a, status);
        }
        return a;
    }
}